

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

QPDFObjectHandle QPDFObjectHandle::newArray(Matrix *matrix)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  QPDFObjectHandle QVar2;
  initializer_list<QPDFObjectHandle> __l;
  bool in_stack_ffffffffffffff5b;
  int in_stack_ffffffffffffff5c;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_a0;
  element_type *in_stack_ffffffffffffff78;
  
  newReal((double)in_stack_ffffffffffffff78,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff5b);
  newReal((double)in_stack_ffffffffffffff78,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff5b);
  newReal((double)in_stack_ffffffffffffff78,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff5b);
  newReal((double)in_stack_ffffffffffffff78,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff5b);
  newReal((double)in_stack_ffffffffffffff78,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff5b);
  newReal((double)in_stack_ffffffffffffff78,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff5b);
  __l._M_len = 6;
  __l._M_array = (iterator)&stack0xffffffffffffff78;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            (&local_a0,__l,(allocator_type *)&stack0xffffffffffffff5f);
  newArray((QPDFObjectHandle *)matrix,&local_a0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_a0);
  lVar1 = 0x58;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&stack0xffffffffffffff78 + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)matrix;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newArray(Matrix const& matrix)
{
    return newArray(
        {newReal(matrix.a),
         newReal(matrix.b),
         newReal(matrix.c),
         newReal(matrix.d),
         newReal(matrix.e),
         newReal(matrix.f)});
}